

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O3

void SetAccessorRange<signed_char>
               (Ref<glTF::Accessor> acc,void *data,uint count,uint numCompsIn,uint numCompsOut)

{
  double *pdVar1;
  long lVar2;
  undefined4 in_register_0000000c;
  ulong uVar3;
  ulong uVar4;
  Accessor *pAVar5;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar6;
  void *pvVar7;
  uint uVar8;
  double dVar9;
  double local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,count);
  pvVar6 = acc.vector;
  if (numCompsOut <= numCompsIn) {
    uVar4 = acc._8_8_ & 0xffffffff;
    if (numCompsOut != 0) {
      uVar8 = numCompsOut;
      do {
        local_40 = 1.79769313486232e+308;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (&(pvVar6->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar4]->min,&local_40);
        local_40 = -1.79769313486232e+308;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (&(pvVar6->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar4]->max,&local_40);
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    uVar8 = (int)local_38 * numCompsIn;
    if (uVar8 != 0) {
      pvVar7 = (void *)((ulong)uVar8 + (long)data);
      do {
        if (numCompsOut != 0) {
          uVar3 = 0;
          do {
            dVar9 = (double)(int)*(char *)((long)data + uVar3);
            pAVar5 = (pvVar6->
                     super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar4];
            lVar2 = *(long *)&(pAVar5->min).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data;
            if (dVar9 < *(double *)(lVar2 + uVar3 * 8)) {
              *(double *)(lVar2 + uVar3 * 8) = dVar9;
              pAVar5 = (pvVar6->
                       super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar4];
            }
            lVar2 = *(long *)&(pAVar5->max).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data;
            pdVar1 = (double *)(lVar2 + uVar3 * 8);
            if (*pdVar1 <= dVar9 && dVar9 != *pdVar1) {
              *(double *)(lVar2 + uVar3 * 8) = dVar9;
            }
            uVar3 = uVar3 + 1;
          } while (numCompsOut != uVar3);
        }
        data = (void *)((long)data + (ulong)numCompsIn);
      } while (data < pvVar7);
    }
    return;
  }
  __assert_fail("numCompsOut <= numCompsIn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFExporter.cpp"
                ,0xb6,
                "void SetAccessorRange(Ref<Accessor>, void *, unsigned int, unsigned int, unsigned int) [T = signed char]"
               );
}

Assistant:

void SetAccessorRange(Ref<Accessor> acc, void* data, unsigned int count,
	unsigned int numCompsIn, unsigned int numCompsOut)
{
	ai_assert(numCompsOut <= numCompsIn);

	// Allocate and initialize with large values.
	for (unsigned int i = 0 ; i < numCompsOut ; i++) {
		acc->min.push_back( std::numeric_limits<double>::max());
		acc->max.push_back(-std::numeric_limits<double>::max());
	}

	size_t totalComps = count * numCompsIn;
	T* buffer_ptr = static_cast<T*>(data);
	T* buffer_end = buffer_ptr + totalComps;

	// Search and set extreme values.
	for (; buffer_ptr < buffer_end ; buffer_ptr += numCompsIn) {
		for (unsigned int j = 0 ; j < numCompsOut ; j++) {
			double valueTmp = buffer_ptr[j];

			if (valueTmp < acc->min[j]) {
				acc->min[j] = valueTmp;
			}
			if (valueTmp > acc->max[j]) {
				acc->max[j] = valueTmp;
			}
		}
	}
}